

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void printoption(SessionHandle *data,char *direction,int cmd,int option)

{
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *opt;
  char *fmt;
  int option_local;
  int cmd_local;
  char *direction_local;
  SessionHandle *data_local;
  
  if (((data->set).verbose & 1U) != 0) {
    if (cmd == 0xff) {
      if (((uint)option < 0xec) || (0xff < (uint)option)) {
        Curl_infof(data,"%s IAC %d\n",direction,(ulong)(uint)option);
      }
      else {
        Curl_infof(data,"%s IAC %s\n",direction,telnetcmds[option + -0xec]);
      }
    }
    else {
      if (cmd == 0xfb) {
        local_38 = "WILL";
      }
      else {
        if (cmd == 0xfc) {
          local_40 = "WONT";
        }
        else {
          if (cmd == 0xfd) {
            local_48 = "DO";
          }
          else {
            local_48 = (char *)0x0;
            if (cmd == 0xfe) {
              local_48 = "DONT";
            }
          }
          local_40 = local_48;
        }
        local_38 = local_40;
      }
      if (local_38 == (char *)0x0) {
        Curl_infof(data,"%s %d %d\n",direction,(ulong)(uint)cmd,(ulong)(uint)option);
      }
      else {
        if (option < 0x28) {
          local_30 = telnetoptions[option];
        }
        else if (option == 0xff) {
          local_30 = "EXOPL";
        }
        else {
          local_30 = (char *)0x0;
        }
        if (local_30 == (char *)0x0) {
          Curl_infof(data,"%s %s %d\n",direction,local_38,(ulong)(uint)option);
        }
        else {
          Curl_infof(data,"%s %s %s\n",direction,local_38,local_30);
        }
      }
    }
  }
  return;
}

Assistant:

static void printoption(struct SessionHandle *data,
                        const char *direction, int cmd, int option)
{
  const char *fmt;
  const char *opt;

  if(data->set.verbose) {
    if(cmd == CURL_IAC) {
      if(CURL_TELCMD_OK(option))
        infof(data, "%s IAC %s\n", direction, CURL_TELCMD(option));
      else
        infof(data, "%s IAC %d\n", direction, option);
    }
    else {
      fmt = (cmd == CURL_WILL) ? "WILL" : (cmd == CURL_WONT) ? "WONT" :
        (cmd == CURL_DO) ? "DO" : (cmd == CURL_DONT) ? "DONT" : 0;
      if(fmt) {
        if(CURL_TELOPT_OK(option))
          opt = CURL_TELOPT(option);
        else if(option == CURL_TELOPT_EXOPL)
          opt = "EXOPL";
        else
          opt = NULL;

        if(opt)
          infof(data, "%s %s %s\n", direction, fmt, opt);
        else
          infof(data, "%s %s %d\n", direction, fmt, option);
      }
      else
        infof(data, "%s %d %d\n", direction, cmd, option);
    }
  }
}